

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,bool isStatic)

{
  ushort uVar1;
  size_t sVar2;
  size_t sVar3;
  ushort uVar4;
  bool bVar5;
  runtime_error *this_00;
  char *pcVar6;
  iterator __pos;
  _Base_ptr p_Var7;
  CZString actualKey;
  value_type defaultValue;
  CZString local_b0;
  undefined4 local_9c;
  char *local_98;
  pair<const_Json::Value::CZString,_Json::Value> local_90;
  ValueHolder local_58;
  ushort local_50;
  undefined2 uStack_4e;
  undefined8 local_48;
  size_t sStack_40;
  size_t local_38;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    local_9c = 0;
    uVar4 = (ushort)_local_50 & 0xfe00;
    local_48 = 0;
    sStack_40 = 0;
    local_38 = 0;
    local_98 = key;
    local_50 = uVar4 + 7;
    pcVar6 = (char *)operator_new(0x30);
    pcVar6[0x10] = '\0';
    pcVar6[0x11] = '\0';
    pcVar6[0x12] = '\0';
    pcVar6[0x13] = '\0';
    pcVar6[0x14] = '\0';
    pcVar6[0x15] = '\0';
    pcVar6[0x16] = '\0';
    pcVar6[0x17] = '\0';
    pcVar6[0x18] = '\0';
    pcVar6[0x19] = '\0';
    pcVar6[0x1a] = '\0';
    pcVar6[0x1b] = '\0';
    pcVar6[0x1c] = '\0';
    pcVar6[0x1d] = '\0';
    pcVar6[0x1e] = '\0';
    pcVar6[0x1f] = '\0';
    pcVar6[0x20] = '\0';
    pcVar6[0x21] = '\0';
    pcVar6[0x22] = '\0';
    pcVar6[0x23] = '\0';
    pcVar6[0x24] = '\0';
    pcVar6[0x25] = '\0';
    pcVar6[0x26] = '\0';
    pcVar6[0x27] = '\0';
    pcVar6[0x28] = '\0';
    pcVar6[0x29] = '\0';
    pcVar6[0x2a] = '\0';
    pcVar6[0x2b] = '\0';
    pcVar6[0x2c] = '\0';
    pcVar6[0x2d] = '\0';
    pcVar6[0x2e] = '\0';
    pcVar6[0x2f] = '\0';
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    pcVar6[8] = '\0';
    pcVar6[9] = '\0';
    pcVar6[10] = '\0';
    pcVar6[0xb] = '\0';
    pcVar6[0xc] = '\0';
    pcVar6[0xd] = '\0';
    pcVar6[0xe] = '\0';
    pcVar6[0xf] = '\0';
    *(char **)(pcVar6 + 0x18) = pcVar6 + 8;
    *(char **)(pcVar6 + 0x20) = pcVar6 + 8;
    pcVar6[0x28] = '\0';
    pcVar6[0x29] = '\0';
    pcVar6[0x2a] = '\0';
    pcVar6[0x2b] = '\0';
    pcVar6[0x2c] = '\0';
    pcVar6[0x2d] = '\0';
    pcVar6[0x2e] = '\0';
    pcVar6[0x2f] = '\0';
    *(ushort *)&this->field_0x8 = uVar1 & 0xff00 | 7;
    local_58 = this->value_;
    (this->value_).string_ = pcVar6;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 7;
    _local_50 = CONCAT22(uStack_4e,uVar1 & 0x100 | uVar4 + (short)local_9c);
    sVar2 = this->start_;
    this->start_ = sStack_40;
    sVar3 = this->limit_;
    this->limit_ = local_38;
    sStack_40 = sVar2;
    local_38 = sVar3;
    ~Value((Value *)&local_58);
    key = local_98;
  }
  else if ((char)uVar1 != '\a') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::resolveReference(): requires objectValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CZString::CZString(&local_b0,key,(uint)!isStatic * 2);
  p_Var7 = (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != (_Base_ptr)0x0) {
    do {
      bVar5 = CZString::operator<((CZString *)(p_Var7 + 1),&local_b0);
      if (!bVar5) {
        __pos._M_node = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar5];
    } while (p_Var7 != (_Base_ptr)0x0);
  }
  if ((_Rb_tree_header *)__pos._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    bVar5 = CZString::operator==((CZString *)(__pos._M_node + 1),&local_b0);
    if (bVar5) goto LAB_0052c58c;
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            (&local_90,&local_b0,(Value *)kNull);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,__pos._M_node,&local_90);
  ~Value(&local_90.second);
  if ((local_90.first.cstr_ != (char *)0x0) && (local_90.first.index_ == 1)) {
    free(local_90.first.cstr_);
  }
LAB_0052c58c:
  if ((local_b0.cstr_ != (char *)0x0) && (local_b0.index_ == 1)) {
    free(local_b0.cstr_);
  }
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::resolveReference(const char* key, bool isStatic) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString actualKey(
      key, isStatic ? CZString::noDuplication : CZString::duplicateOnCopy);
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, null);
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
#else
  return value_.map_->resolveReference(key, isStatic);
#endif
}